

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

bool __thiscall sf::RenderTarget::setActive(RenderTarget *this,bool active)

{
  mapped_type_conflict3 mVar1;
  mapped_type_conflict3 *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  Lock lock;
  Uint64 contextId;
  Lock LStack_28;
  Uint64 local_20;
  
  Lock::Lock(&LStack_28,(Mutex *)&(anonymous_namespace)::RenderTargetImpl::mutex);
  local_20 = Context::getActiveContextId();
  p_Var3 = (_Base_ptr)((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap + 8);
  if ((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap._16_8_ != 0) {
    p_Var3 = (_Base_ptr)((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap + 8);
    p_Var4 = (_Base_ptr)(anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap._16_8_;
    do {
      if (*(ulong *)(p_Var4 + 1) >= local_20) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < local_20];
    } while (p_Var4 != (_Base_ptr)0x0);
  }
  __position._M_node =
       (_Base_ptr)((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap + 8);
  if ((p_Var3 != (_Base_ptr)((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap + 8))
     && (__position._M_node =
              (_Base_ptr)((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap + 8),
        *(ulong *)(p_Var3 + 1) <= local_20)) {
    __position._M_node = p_Var3;
  }
  if (active) {
    if (__position._M_node ==
        (_Base_ptr)((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap + 8)) {
      mVar1 = this->m_id;
      pmVar2 = std::
               map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
               ::operator[]((map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
                             *)(anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap,
                            &local_20);
      *pmVar2 = mVar1;
      (this->m_cache).glStatesSet = false;
    }
    else {
      if (__position._M_node[1]._M_parent == (_Base_ptr)this->m_id) goto LAB_001b8101;
      __position._M_node[1]._M_parent = (_Base_ptr)this->m_id;
    }
  }
  else if (__position._M_node !=
           (_Base_ptr)((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap + 8)) {
    std::
    _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,unsigned_long_long>,std::_Select1st<std::pair<unsigned_long_long_const,unsigned_long_long>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_long_long>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,unsigned_long_long>,std::_Select1st<std::pair<unsigned_long_long_const,unsigned_long_long>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,unsigned_long_long>>>
                        *)(anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap,__position
                      );
  }
  (this->m_cache).enable = false;
LAB_001b8101:
  Lock::~Lock(&LStack_28);
  return true;
}

Assistant:

bool RenderTarget::setActive(bool active)
{
    // Mark this RenderTarget as active or no longer active in the tracking map
    {
        sf::Lock lock(RenderTargetImpl::mutex);

        Uint64 contextId = Context::getActiveContextId();

        using RenderTargetImpl::contextRenderTargetMap;
        RenderTargetImpl::ContextRenderTargetMap::iterator iter = contextRenderTargetMap.find(contextId);

        if (active)
        {
            if (iter == contextRenderTargetMap.end())
            {
                contextRenderTargetMap[contextId] = m_id;

                m_cache.glStatesSet = false;
                m_cache.enable = false;
            }
            else if (iter->second != m_id)
            {
                iter->second = m_id;

                m_cache.enable = false;
            }
        }
        else
        {
            if (iter != contextRenderTargetMap.end())
                contextRenderTargetMap.erase(iter);

            m_cache.enable = false;
        }
    }

    return true;
}